

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O0

HighsStatus __thiscall Highs::completeSolutionFromDiscreteAssignment(Highs *this)

{
  value_type vVar1;
  HighsStatus HVar2;
  uint uVar3;
  size_type sVar4;
  reference pvVar5;
  reference pvVar6;
  long in_RDI;
  bool *in_stack_00000020;
  bool *in_stack_00000028;
  HighsSolution *in_stack_00000030;
  HighsLp *in_stack_00000038;
  HighsOptions *in_stack_00000040;
  string *in_stack_00000048;
  HighsInt mip_max_nodes;
  HighsStatus return_status;
  bool few_fixed_discrete_variables;
  bool call_run;
  HighsInt num_continuous_variable;
  HighsInt num_discrete_variable;
  double integer_infeasibility;
  double col_infeasibility;
  HighsVarType type;
  double upper;
  double lower;
  double primal;
  HighsInt iCol;
  HighsInt num_unfixed_discrete_variable;
  HighsInt num_fixed_discrete_variable;
  bool have_integrality;
  vector<HighsVarType,_std::allocator<HighsVarType>_> save_integrality;
  vector<double,_std::allocator<double>_> save_col_upper;
  vector<double,_std::allocator<double>_> save_col_lower;
  HighsStatus return_status_1;
  bool feasible;
  bool integral;
  bool valid;
  bool contains_undefined_values;
  HighsLp *lp;
  double *in_stack_fffffffffffffeb8;
  undefined7 in_stack_fffffffffffffec0;
  HighsVarType in_stack_fffffffffffffec7;
  undefined4 in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_stack_fffffffffffffed0;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_stack_fffffffffffffed8;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *pvVar7;
  undefined7 in_stack_fffffffffffffee0;
  value_type vVar8;
  undefined4 in_stack_ffffffffffffff08;
  undefined4 in_stack_ffffffffffffff0c;
  undefined4 uVar9;
  undefined4 in_stack_ffffffffffffff10;
  undefined2 in_stack_ffffffffffffff14;
  undefined1 in_stack_ffffffffffffff16;
  undefined1 in_stack_ffffffffffffff17;
  byte bVar10;
  int local_b0;
  int local_ac;
  uint uVar11;
  undefined4 in_stack_ffffffffffffff5c;
  uint uVar12;
  vector<HighsVarType,_std::allocator<HighsVarType>_> *in_stack_ffffffffffffff60;
  allocator local_41;
  string local_40 [32];
  HighsStatus local_20;
  byte local_1c [3];
  undefined1 local_19;
  uint *local_18;
  HighsStatus local_4;
  
  local_18 = (uint *)(in_RDI + 0x138);
  local_19 = HighsSolution::hasUndefined
                       ((HighsSolution *)
                        CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  if (!(bool)local_19) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_40,"",&local_41);
    in_stack_fffffffffffffeb8 = (double *)local_1c;
    HVar2 = assessLpPrimalSolution
                      (in_stack_00000048,in_stack_00000040,in_stack_00000038,in_stack_00000030,
                       in_stack_00000028,in_stack_00000020,_num_continuous_variable);
    std::__cxx11::string::~string(local_40);
    std::allocator<char>::~allocator((allocator<char> *)&local_41);
    local_20 = HVar2;
    if ((local_1c[0] & 1) != 0) {
      return kOk;
    }
  }
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_ffffffffffffff17,
                      CONCAT16(in_stack_ffffffffffffff16,
                               CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))),
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT17(in_stack_ffffffffffffff17,
                      CONCAT16(in_stack_ffffffffffffff16,
                               CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))),
             (vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::vector
            ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
             CONCAT17(in_stack_ffffffffffffff17,
                      CONCAT16(in_stack_ffffffffffffff16,
                               CONCAT24(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))),
             (vector<HighsVarType,_std::allocator<HighsVarType>_> *)
             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08));
  sVar4 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::size
                    ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(local_18 + 0x5e));
  uVar12 = CONCAT13(sVar4 != 0,(int3)in_stack_ffffffffffffff5c);
  uVar11 = 0;
  local_ac = 0;
  for (local_b0 = 0; local_b0 < (int)*local_18; local_b0 = local_b0 + 1) {
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),(long)local_b0);
    pvVar7 = (vector<HighsVarType,_std::allocator<HighsVarType>_> *)*pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(local_18 + 8),(long)local_b0);
    vVar1 = *pvVar5;
    pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x10),(long)local_b0);
    *pvVar5 = vVar1;
    pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                       ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)(local_18 + 0x5e),
                        (long)local_b0);
    if (*pvVar6 != kContinuous) {
      if (((double)pvVar7 != INFINITY) || (NAN((double)pvVar7))) {
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_18 + 8),(long)local_b0);
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)(local_18 + 0xe),(long)local_b0);
        if ((uVar12 & 0x1000000) == 0) {
          vVar8 = kContinuous;
        }
        else {
          pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                             ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                              (local_18 + 0x5e),(long)local_b0);
          vVar8 = *pvVar6;
        }
        assessColPrimalSolution
                  ((HighsOptions *)CONCAT17(vVar8,in_stack_fffffffffffffee0),
                   (double)in_stack_fffffffffffffed8,(double)in_stack_fffffffffffffed0,
                   (double)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                   in_stack_fffffffffffffec7,in_stack_fffffffffffffeb8,(double *)0x48ccaa);
        if (0.0 < *(double *)(in_RDI + 0xdd0) || *(double *)(in_RDI + 0xdd0) == 0.0) {
          uVar11 = uVar11 + 1;
          in_stack_fffffffffffffed0 = pvVar7;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 8),
                              (long)local_b0);
          *pvVar5 = (value_type)in_stack_fffffffffffffed0;
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(local_18 + 0xe),
                              (long)local_b0);
          *pvVar5 = (value_type)pvVar7;
          pvVar6 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                             ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                              (local_18 + 0x5e),(long)local_b0);
          *pvVar6 = kContinuous;
          in_stack_fffffffffffffed8 = pvVar7;
        }
        else {
          local_ac = local_ac + 1;
        }
      }
      else {
        local_ac = local_ac + 1;
      }
    }
  }
  uVar3 = local_ac + uVar11;
  bVar10 = 1;
  if (local_ac == 0) {
    if (*local_18 == uVar3) {
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,
                   "User-supplied values of discrete variables cannot yield feasible solution\n");
      bVar10 = 0;
    }
    else {
      std::vector<HighsVarType,_std::allocator<HighsVarType>_>::clear
                ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)0x48ce36);
      highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,
                   "Attempting to find feasible solution by solving LP for user-supplied values of discrete variables\n"
                  );
    }
  }
  else if ((int)(uVar11 * 10) < (int)uVar3) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kWarning,
                 "User-supplied values fix only %d / %d discrete variables, so attempt to complete a feasible solution may be expensive\n"
                 ,(ulong)uVar11,(ulong)uVar3);
  }
  else {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kInfo,
                 "Attempting to find feasible solution by solving MIP for user-supplied values of %d / %d discrete variables\n"
                 ,(ulong)uVar11,(ulong)uVar3);
  }
  HVar2 = kOk;
  HighsSolution::clear
            ((HighsSolution *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
  if ((bVar10 & 1) != 0) {
    uVar9 = *(undefined4 *)(in_RDI + 0xda4);
    *(undefined4 *)(in_RDI + 0xda4) = *(undefined4 *)(in_RDI + 0xdac);
    HighsBasis::clear((HighsBasis *)CONCAT17(in_stack_fffffffffffffec7,in_stack_fffffffffffffec0));
    HVar2 = run((Highs *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
    *(undefined4 *)(in_RDI + 0xda4) = uVar9;
  }
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
             (vector<double,_std::allocator<double>_> *)CONCAT44(uVar12,uVar11));
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60,
             (vector<double,_std::allocator<double>_> *)CONCAT44(uVar12,uVar11));
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator=
            (in_stack_ffffffffffffff60,
             (vector<HighsVarType,_std::allocator<HighsVarType>_> *)CONCAT44(uVar12,uVar11));
  if (HVar2 == kError) {
    highsLogUser((HighsLogOptions *)(in_RDI + 0xe28),kError,
                 "Highs::run() error trying to find feasible solution\n");
    local_4 = kError;
  }
  else {
    local_4 = kOk;
  }
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::~vector(in_stack_fffffffffffffed0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffed0);
  return local_4;
}

Assistant:

HighsStatus Highs::completeSolutionFromDiscreteAssignment() {
  // Determine whether the current solution of a MIP is feasible and,
  // if not, try to assign values to continuous variables and discrete
  // variables not at integer values to achieve a feasible
  // solution. Valuable in the case where users make a heuristic
  // (partial) assignment of discrete variables
  assert(model_.isMip() && solution_.value_valid);
  HighsLp& lp = model_.lp_;
  // Determine whether the solution contains undefined values, in
  // order to decide whether to check its feasibility
  const bool contains_undefined_values = solution_.hasUndefined();
  if (!contains_undefined_values) {
    bool valid, integral, feasible;
    // Determine whether this solution is integer feasible
    HighsStatus return_status = assessLpPrimalSolution(
        "", options_, lp, solution_, valid, integral, feasible);
    assert(return_status != HighsStatus::kError);
    assert(valid);
    // If the current solution is integer feasible, then it can be
    // used by MIP solver to get a primal bound
    if (feasible) return HighsStatus::kOk;
  }
  // Save the column bounds and integrality in preparation for fixing
  // the discrete variables when user-supplied values are
  // integer
  std::vector<double> save_col_lower = lp.col_lower_;
  std::vector<double> save_col_upper = lp.col_upper_;
  std::vector<HighsVarType> save_integrality = lp.integrality_;
  const bool have_integrality = (lp.integrality_.size() != 0);
  assert(have_integrality);
  // Count the number of fixed and unfixed discrete variables
  HighsInt num_fixed_discrete_variable = 0;
  HighsInt num_unfixed_discrete_variable = 0;
  for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++) {
    const double primal = solution_.col_value[iCol];
    // Default value is lower bound, unless primal is integer for a
    // discrete variable
    solution_.col_value[iCol] = lp.col_lower_[iCol];
    if (lp.integrality_[iCol] == HighsVarType::kContinuous) continue;
    // Fix discrete variable if its value is defined and integer
    if (primal == kHighsUndefined) {
      num_unfixed_discrete_variable++;
    } else {
      const double lower = lp.col_lower_[iCol];
      const double upper = lp.col_upper_[iCol];
      const HighsVarType type =
          have_integrality ? lp.integrality_[iCol] : HighsVarType::kContinuous;
      double col_infeasibility = 0;
      double integer_infeasibility = 0;
      assessColPrimalSolution(options_, primal, lower, upper, type,
                              col_infeasibility, integer_infeasibility);
      if (integer_infeasibility > options_.mip_feasibility_tolerance) {
        num_unfixed_discrete_variable++;
      } else {
        // Variable is integer feasible, so fix it at this value and
        // remove its integrality
        num_fixed_discrete_variable++;
        lp.col_lower_[iCol] = primal;
        lp.col_upper_[iCol] = primal;
        lp.integrality_[iCol] = HighsVarType::kContinuous;
      }
    }
  }
  assert(!solution_.hasUndefined());
  const HighsInt num_discrete_variable =
      num_unfixed_discrete_variable + num_fixed_discrete_variable;
  const HighsInt num_continuous_variable = lp.num_col_ - num_discrete_variable;
  assert(num_continuous_variable >= 0);
  bool call_run = true;
  const bool few_fixed_discrete_variables =
      10 * num_fixed_discrete_variable < num_discrete_variable;
  if (num_unfixed_discrete_variable == 0) {
    // Solution is integer valued
    if (num_continuous_variable == 0) {
      // There are no continuous variables, so no feasible solution can be
      // deduced
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "User-supplied values of discrete variables cannot yield "
                   "feasible solution\n");
      call_run = false;
    } else {
      // Solve an LP, so clear all integrality
      lp.integrality_.clear();
      highsLogUser(
          options_.log_options, HighsLogType::kInfo,
          "Attempting to find feasible solution "
          "by solving LP for user-supplied values of discrete variables\n");
    }
  } else {
    // There are unfixed discrete variables
    if (few_fixed_discrete_variables) {
      // Too few discrete variables are fixed so warn, but still
      // attempt to complete a feasible solution
      highsLogUser(
          options_.log_options, HighsLogType::kWarning,
          "User-supplied values fix only %d / %d discrete variables, "
          "so attempt to complete a feasible solution may be expensive\n",
          int(num_fixed_discrete_variable), int(num_discrete_variable));
    } else {
      highsLogUser(options_.log_options, HighsLogType::kInfo,
                   "Attempting to find feasible solution "
                   "by solving MIP for user-supplied values of %d / %d "
                   "discrete variables\n",
                   int(num_fixed_discrete_variable),
                   int(num_discrete_variable));
    }
  }
  HighsStatus return_status = HighsStatus::kOk;
  // Clear the current solution since either the user solution has
  // been used to fix (a subset of) discrete variables - so a valid
  // solution will be obtained from run() if the local model is
  // feasible - or it's not worth using the user solution
  solution_.clear();
  if (call_run) {
    // Solve the model, using mip_max_start_nodes for
    // mip_max_nodes...
    const HighsInt mip_max_nodes = options_.mip_max_nodes;
    options_.mip_max_nodes = options_.mip_max_start_nodes;
    // Solve the model
    basis_.clear();
    return_status = this->run();
    // ... remembering to recover the original value of mip_max_nodes
    options_.mip_max_nodes = mip_max_nodes;
  }
  // Recover the column bounds and integrality
  lp.col_lower_ = save_col_lower;
  lp.col_upper_ = save_col_upper;
  lp.integrality_ = save_integrality;
  // Handle the error return
  if (return_status == HighsStatus::kError) {
    highsLogUser(options_.log_options, HighsLogType::kError,
                 "Highs::run() error trying to find feasible solution\n");
    return HighsStatus::kError;
  }
  return HighsStatus::kOk;
}